

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O2

SSL_CREDENTIAL *
SSL_CREDENTIAL_new_spake2plusv1_server
          (uint8_t *context,size_t context_len,uint8_t *client_identity,size_t client_identity_len,
          uint8_t *server_identity,size_t server_identity_len,uint32_t rate_limit,uint8_t *w0,
          size_t w0_len,uint8_t *registration_record,size_t registration_record_len)

{
  Span<const_unsigned_char> server_identity_00;
  bool bVar1;
  _Head_base<0UL,_ssl_credential_st_*,_false> _Var2;
  Span<const_unsigned_char> client_identity_00;
  Span<const_unsigned_char> context_00;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  UniquePtr<SSL_CREDENTIAL> cred;
  
  if ((registration_record_len == 0x41 && w0_len == 0x20) &&
     (context != (uint8_t *)0x0 || context_len == 0)) {
    server_identity_00.size_ = server_identity_len;
    server_identity_00.data_ = server_identity;
    client_identity_00.size_ = (size_t)client_identity;
    client_identity_00.data_ = (uchar *)context_len;
    context_00.size_ = (size_t)context;
    context_00.data_ = (uchar *)0x3;
    ssl_credential_new_spake2plusv1
              ((SSLCredentialType)&cred,context_00,client_identity_00,server_identity_00,
               (uint32_t)client_identity_len);
    if ((((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)
          cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0) ||
        (in.size_ = 0x20, in.data_ = w0,
        bVar1 = bssl::Array<unsigned_char>::CopyFrom
                          ((Array<unsigned_char> *)
                           ((long)cred._M_t.
                                  super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl +
                           0x88),in), !bVar1)) ||
       (in_00.size_ = 0x41, in_00.data_ = registration_record,
       bVar1 = bssl::Array<unsigned_char>::CopyFrom
                         ((Array<unsigned_char> *)
                          ((long)cred._M_t.
                                 super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl +
                          0xa8),in_00), _Var2._M_head_impl = (ssl_credential_st *)cred, !bVar1)) {
      _Var2._M_head_impl = (ssl_credential_st *)0x0;
    }
    else {
      cred._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ssl_credential_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>)0x0;
    }
    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&cred);
    return (SSL_CREDENTIAL *)(tuple<ssl_credential_st_*,_bssl::internal::Deleter>)_Var2._M_head_impl
    ;
  }
  return (SSL_CREDENTIAL *)0x0;
}

Assistant:

SSL_CREDENTIAL *SSL_CREDENTIAL_new_spake2plusv1_server(
    const uint8_t *context, size_t context_len, const uint8_t *client_identity,
    size_t client_identity_len, const uint8_t *server_identity,
    size_t server_identity_len, uint32_t rate_limit, const uint8_t *w0,
    size_t w0_len, const uint8_t *registration_record,
    size_t registration_record_len) {
  if (w0_len != spake2plus::kVerifierSize ||
      registration_record_len != spake2plus::kRegistrationRecordSize ||
      (context == nullptr && context_len != 0)) {
    return nullptr;
  }

  UniquePtr<SSL_CREDENTIAL> cred = ssl_credential_new_spake2plusv1(
      SSLCredentialType::kSPAKE2PlusV1Server, Span(context, context_len),
      Span(client_identity, client_identity_len),
      Span(server_identity, server_identity_len), rate_limit);
  if (!cred) {
    return nullptr;
  }

  if (!cred->password_verifier_w0.CopyFrom(Span(w0, w0_len)) ||
      !cred->registration_record.CopyFrom(
          Span(registration_record, registration_record_len))) {
    return nullptr;
  }

  return cred.release();
}